

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  rc_data *prVar1;
  long lVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_register_00001304 [12];
  float local_4c;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (begin == end) {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        local_4c = 0.0;
      }
      else {
        auVar6 = ZEXT816(0) << 0x40;
        auVar5._8_4_ = 0x7fffffff;
        auVar5._0_8_ = 0x7fffffff7fffffff;
        auVar5._12_4_ = 0x7fffffff;
        do {
          auVar4._0_4_ = (float)(this->A)._M_t.
                                super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl
                                [*local_38._M_head_impl];
          auVar4._4_12_ = in_register_00001304;
          auVar4 = vandps_avx(auVar4,auVar5);
          auVar6 = vfmadd231ss_fma(auVar6,auVar4,
                                   ZEXT416((uint)((this->pi)._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl[*(local_38._M_head_impl + 4)] +
                                                 (this->P)._M_t.
                                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                 .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                                 [*local_38._M_head_impl])));
          local_38._M_head_impl = local_38._M_head_impl + 8;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
        local_4c = auVar6._0_4_;
      }
      prVar1 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
               ._M_head_impl;
      prVar1[lVar2].id = (int)lVar2;
      prVar1[lVar2].f =
           (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl[begin->value];
      fVar3 = quadratic_cost_type<float>::operator()(this->c,begin->column,x);
      (this->R)._M_t.
      super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
      .
      super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
      ._M_head_impl[lVar2].value = fVar3 - local_4c;
      lVar2 = lVar2 + 1;
      begin = begin + 1;
    } while (begin != end);
  }
  return (int)lVar2;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        // to_log(
        //  debug_os, "  compute-reduced-cost {}\n", std::distance(begin,
        //  end));

        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi_p = 0;

            for (auto [first, last] = ap.column(begin->column); first != last;
                 ++first) {
                auto a = std::abs(static_cast<Float>(A[first->value]));
                sum_a_pi_p += a * (pi[first->row] + P[first->value]);
            }

            R[r_size].id = r_size;
            R[r_size].f = A[begin->value];
            R[r_size].value = c(begin->column, x) - sum_a_pi_p;

            // to_log(debug_os,
            //       4u,
            //       "Compute: {} = {} - {} - {}\n",
            //       r_size,
            //       c(begin->column, x),
            //       sum_pi,
            //       sum_p);

            // to_log(debug_os, 4u, "{}x{}\n", R[r_size].f, R[r_size].value);

            ++r_size;
        }

        // to_log(debug_os, "\n");

        return r_size;
    }